

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs,
          Graph *nodes2ents)

{
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *mesh_00;
  bool bVar1;
  int iVar2;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  Read<signed_char> RVar4;
  Read<signed_char> local_128;
  Read<signed_char> local_118;
  Read<signed_char> local_108;
  Graph local_f8;
  undefined1 local_d8 [8];
  Read<signed_char> class_dim_marks;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> dim_class_ids;
  int class_dim;
  allocator local_91;
  string local_90 [39];
  undefined1 local_69;
  int local_68;
  Int local_64;
  int nnodes;
  Int dim;
  Graph *nodes2ents_local;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs_local;
  Mesh *mesh_local;
  Read<signed_char> *marks;
  Graph *local_38;
  Graph *local_30;
  Graph *local_28;
  ulong local_20;
  Graph *local_18;
  Graph *local_10;
  
  _nnodes = nodes2ents;
  nodes2ents_local = (Graph *)class_pairs;
  class_pairs_local = (vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)mesh;
  mesh_local = (Mesh *)this;
  local_64 = Mesh::dim(mesh);
  local_38 = _nnodes + local_64;
  local_18 = local_38;
  local_10 = local_38;
  if ((local_38->a2ab).write_.shared_alloc_.direct_ptr == (void *)0x0) {
    fail("assertion %s failed at %s +%d\n","nodes2ents[dim].a2ab.exists()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0xb1);
  }
  marks = (Read<signed_char> *)(_nnodes + local_64);
  if (((ulong)(((Graph *)marks)->a2ab).write_.shared_alloc_.alloc & 1) == 0) {
    local_20 = ((((Graph *)marks)->a2ab).write_.shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(((Graph *)marks)->a2ab).write_.shared_alloc_.alloc >> 3;
  }
  iVar2 = (int)(local_20 >> 2) + -1;
  local_69 = 0;
  local_68 = iVar2;
  local_30 = (Graph *)marks;
  local_28 = (Graph *)marks;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  Read<signed_char>::Read((Read<signed_char> *)this,iVar2,'\0',(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pvVar3 = extraout_RDX;
  for (dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage <= local_64;
      dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    get_dim_class_ids((vector<int,_std::allocator<int>_> *)local_c0,
                      (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                      (vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *)
                      nodes2ents_local);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)local_c0);
    mesh_00 = class_pairs_local;
    iVar2 = (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    if (bVar1) {
      class_dim_marks.write_.shared_alloc_.direct_ptr._4_4_ = 4;
    }
    else {
      Graph::Graph(&local_f8,
                   _nnodes + (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      mark_class_closures((Omega_h *)local_d8,(Mesh *)mesh_00,iVar2,
                          (vector<int,_std::allocator<int>_> *)local_c0,&local_f8);
      Graph::~Graph(&local_f8);
      Read<signed_char>::Read(&local_118,(Read<signed_char> *)this);
      Read<signed_char>::Read(&local_128,(Read<signed_char> *)local_d8);
      lor_each((Omega_h *)&local_108,&local_118,&local_128);
      Read<signed_char>::operator=((Read<signed_char> *)this,&local_108);
      Read<signed_char>::~Read(&local_108);
      Read<signed_char>::~Read(&local_128);
      Read<signed_char>::~Read(&local_118);
      Read<signed_char>::~Read((Read<signed_char> *)local_d8);
      class_dim_marks.write_.shared_alloc_.direct_ptr._4_4_ = 0;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_class_closures(Mesh* mesh,
    std::vector<ClassPair> const& class_pairs, Graph nodes2ents[4]) {
  auto dim = mesh->dim();
  OMEGA_H_CHECK(nodes2ents[dim].a2ab.exists());
  auto nnodes = nodes2ents[dim].a2ab.size() - 1;
  auto marks = Read<I8>(nnodes, I8(0));
  for (int class_dim = 0; class_dim <= dim; ++class_dim) {
    auto dim_class_ids = get_dim_class_ids(class_dim, class_pairs);
    if (dim_class_ids.empty()) continue;
    auto class_dim_marks = mark_class_closures(
        mesh, class_dim, dim_class_ids, nodes2ents[class_dim]);
    marks = lor_each(marks, class_dim_marks);
  }
  return marks;
}